

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTDMT_updateCParams_whileCompressing(ZSTDMT_CCtx *mtctx,ZSTD_CCtx_params *cctxParams)

{
  uint uVar1;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters local_34;
  
  uVar1 = (mtctx->params).cParams.windowLog;
  (mtctx->params).compressionLevel = cctxParams->compressionLevel;
  ZSTD_getCParamsFromCCtxParams(&local_34,cctxParams,0xffffffffffffffff,0,ZSTD_cpm_noAttachDict);
  (mtctx->params).cParams.searchLog = local_34.searchLog;
  (mtctx->params).cParams.minMatch = local_34.minMatch;
  (mtctx->params).cParams.targetLength = local_34.targetLength;
  (mtctx->params).cParams.strategy = local_34.strategy;
  (mtctx->params).cParams.windowLog = uVar1;
  (mtctx->params).cParams.chainLog = local_34.chainLog;
  (mtctx->params).cParams.hashLog = local_34.hashLog;
  (mtctx->params).cParams.searchLog = local_34.searchLog;
  return;
}

Assistant:

void ZSTDMT_updateCParams_whileCompressing(ZSTDMT_CCtx* mtctx, const ZSTD_CCtx_params* cctxParams)
{
    U32 const saved_wlog = mtctx->params.cParams.windowLog;   /* Do not modify windowLog while compressing */
    int const compressionLevel = cctxParams->compressionLevel;
    DEBUGLOG(5, "ZSTDMT_updateCParams_whileCompressing (level:%i)",
                compressionLevel);
    mtctx->params.compressionLevel = compressionLevel;
    {   ZSTD_compressionParameters cParams = ZSTD_getCParamsFromCCtxParams(cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
        cParams.windowLog = saved_wlog;
        mtctx->params.cParams = cParams;
    }
}